

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O0

void __thiscall xray_re::xr_visual_object::load(xr_visual_object *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint32_t uVar2;
  size_t sVar3;
  fvector3 *pfVar4;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_visual_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar3 = xr_reader::r_chunk<unsigned_short>(r,0x900,&local_1a);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                  ,0x12,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
  }
  if (local_1a != 0x10 && local_1a != 0x11) {
    __assert_fail("version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                  ,0x13,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
  }
  if (local_1a == 0x10) {
    sVar3 = xr_reader::find_chunk(pxStack_18,0x904);
    pxVar1 = pxStack_18;
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                    ,0x17,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
    }
    pfVar4 = xr_custom_object::co_position(&this->super_xr_custom_object);
    xr_reader::r_fvector3(pxVar1,pfVar4);
    pxVar1 = pxStack_18;
    pfVar4 = xr_custom_object::co_rotation(&this->super_xr_custom_object);
    xr_reader::r_fvector3(pxVar1,pfVar4);
    pxVar1 = pxStack_18;
    pfVar4 = xr_custom_object::co_scale(&this->super_xr_custom_object);
    xr_reader::r_fvector3(pxVar1,pfVar4);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar3 = xr_reader::find_chunk(pxStack_18,0x902);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                  ,0x21,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
  }
  uVar2 = xr_reader::r_u32(pxStack_18);
  *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = uVar2;
  xr_reader::r_u32(pxStack_18);
  xr_reader::r_sz(pxStack_18,&this->m_reference);
  xr_reader::debug_find_chunk(pxStack_18);
  xr_reader::r_chunk<unsigned_int>(pxStack_18,0x905,&this->m_flags);
  return;
}

Assistant:

void xr_visual_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION);

	if (version == SCENEOBJ_VERSION_16) {
		if (!r.find_chunk(SCENEOBJ_CHUNK_PLACEMENT))
			xr_not_expected();
		r.r_fvector3(co_position());
		r.r_fvector3(co_rotation());
		r.r_fvector3(co_scale());
		r.debug_find_chunk();
	}

	xr_custom_object::load(r);

	if (!r.find_chunk(SCENEOBJ_CHUNK_REFERENCE))
		xr_not_expected();
	m_file_version = r.r_u32();
	r.r_u32();
	r.r_sz(m_reference);
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}